

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::SetRawReissueAssetResponse::SetRawReissueAssetResponse
          (SetRawReissueAssetResponse *this)

{
  allocator local_11;
  SetRawReissueAssetResponse *local_10;
  SetRawReissueAssetResponse *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::SetRawReissueAssetResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::SetRawReissueAssetResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::SetRawReissueAssetResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__SetRawReissueAssetResponse_01b4e4c8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  core::
  JsonObjectVector<cfd::js::api::json::IssuanceDataResponse,_cfd::js::api::IssuanceDataResponseStruct>
  ::JsonObjectVector(&this->issuances_);
  CollectFieldName();
  return;
}

Assistant:

SetRawReissueAssetResponse() {
    CollectFieldName();
  }